

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

void __thiscall
btHashedOverlappingPairCache::cleanProxyFromPairs
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy,btDispatcher *dispatcher)

{
  undefined8 in_RDX;
  btDispatcher *in_RDI;
  CleanPairCallback cleanPairs;
  btOverlappingPairCache *pairCache;
  btBroadphaseProxy *in_stack_ffffffffffffffb8;
  CleanPairCallback *in_stack_ffffffffffffffc0;
  btOverlappingPairCache local_38 [4];
  undefined8 local_18;
  
  pairCache = local_38;
  local_18 = in_RDX;
  cleanProxyFromPairs::CleanPairCallback::CleanPairCallback
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,pairCache,in_RDI);
  (*in_RDI->_vptr_btDispatcher[0xc])(in_RDI,pairCache,local_18);
  cleanProxyFromPairs::CleanPairCallback::~CleanPairCallback((CleanPairCallback *)0x166988);
  return;
}

Assistant:

void	btHashedOverlappingPairCache::cleanProxyFromPairs(btBroadphaseProxy* proxy,btDispatcher* dispatcher)
{

	class	CleanPairCallback : public btOverlapCallback
	{
		btBroadphaseProxy* m_cleanProxy;
		btOverlappingPairCache*	m_pairCache;
		btDispatcher* m_dispatcher;

	public:
		CleanPairCallback(btBroadphaseProxy* cleanProxy,btOverlappingPairCache* pairCache,btDispatcher* dispatcher)
			:m_cleanProxy(cleanProxy),
			m_pairCache(pairCache),
			m_dispatcher(dispatcher)
		{
		}
		virtual	bool	processOverlap(btBroadphasePair& pair)
		{
			if ((pair.m_pProxy0 == m_cleanProxy) ||
				(pair.m_pProxy1 == m_cleanProxy))
			{
				m_pairCache->cleanOverlappingPair(pair,m_dispatcher);
			}
			return false;
		}
		
	};

	CleanPairCallback cleanPairs(proxy,this,dispatcher);

	processAllOverlappingPairs(&cleanPairs,dispatcher);

}